

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_db_instance_ip_array_list.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ca97b::Json2Array<aliyun::RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType>
::Json2Array(Json2Array<aliyun::RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType> *this,
            Value *value,
            vector<aliyun::RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType,_std::allocator<aliyun::RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType>_>
            *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_88 [8];
  RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType val;
  int i;
  vector<aliyun::RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType,_std::allocator<aliyun::RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.security_ip_list.field_2._12_4_ = 0; uVar1 = val.security_ip_list.field_2._12_4_,
        AVar3 = Json::Value::size(value), (uint)uVar1 < AVar3;
        val.security_ip_list.field_2._12_4_ = val.security_ip_list.field_2._12_4_ + 1) {
      aliyun::RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType::
      RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType
                ((RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType *)local_88);
      value_00 = Json::Value::operator[](value,val.security_ip_list.field_2._12_4_);
      anon_unknown.dwarf_ca97b::Json2Type
                (value_00,(RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType *)local_88);
      std::
      vector<aliyun::RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType,_std::allocator<aliyun::RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType>_>
      ::push_back(vec,(value_type *)local_88);
      aliyun::RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType::
      ~RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType
                ((RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType *)local_88);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }